

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_tx_size_vartx(MACROBLOCKD *xd,MB_MODE_INFO *mbmi,TX_SIZE tx_size,int depth,int blk_row,
                        int blk_col,aom_writer *w)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  undefined1 in_DL;
  MACROBLOCKD *in_RSI;
  MACROBLOCKD *in_RDI;
  int in_R8D;
  int in_R9D;
  aom_writer *unaff_retaddr;
  int offsetc;
  int col;
  int offsetr;
  int row;
  int bsh;
  int bsw;
  TX_SIZE sub_txs;
  int write_txfm_partition;
  int txb_size_index;
  int ctx;
  int max_blocks_wide;
  int max_blocks_high;
  FRAME_CONTEXT *ec_ctx;
  undefined8 in_stack_ffffffffffffff98;
  aom_cdf_prob *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  int iVar3;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  FRAME_CONTEXT *pFVar5;
  undefined3 in_stack_ffffffffffffffec;
  undefined4 uVar6;
  TX_SIZE TVar7;
  byte bVar8;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  uVar6 = CONCAT13(in_DL,in_stack_ffffffffffffffec);
  pFVar5 = in_RDI->tile_ctx;
  iVar1 = max_block_high(in_RDI,(BLOCK_SIZE)in_RSI->mi_row,0);
  iVar2 = max_block_wide(in_RDI,(BLOCK_SIZE)in_RSI->mi_row,0);
  if ((in_R8D < iVar1) && (in_R9D < iVar2)) {
    if (in_ECX == 2) {
      TVar7 = (TX_SIZE)((uint)uVar6 >> 0x18);
      txfm_partition_update
                (in_RDI->above_txfm_context + in_R9D,in_RDI->left_txfm_context + in_R8D,TVar7,TVar7)
      ;
    }
    else {
      txfm_partition_context
                ((TXFM_CONTEXT *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 (TXFM_CONTEXT *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (BLOCK_SIZE)((uint)in_stack_ffffffffffffffac >> 0x18),
                 (TX_SIZE)((uint)in_stack_ffffffffffffffac >> 0x10));
      iVar1 = av1_get_txb_size_index((BLOCK_SIZE)in_RSI->mi_row,in_R8D,in_R9D);
      bVar8 = (byte)((uint)uVar6 >> 0x18);
      if (bVar8 == *(byte *)((long)in_RSI->plane[0].seg_dequant_QTX[0] + (long)iVar1 + 2)) {
        aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                         ,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0,iVar4);
        TVar7 = (TX_SIZE)((uint)uVar6 >> 0x18);
        txfm_partition_update
                  (in_RDI->above_txfm_context + in_R9D,in_RDI->left_txfm_context + in_R8D,TVar7,
                   TVar7);
      }
      else {
        bVar8 = ""[bVar8];
        iVar1 = tx_size_wide_unit[bVar8];
        iVar2 = tx_size_high_unit[bVar8];
        aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                         ,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0,iVar4);
        if (bVar8 == 0) {
          txfm_partition_update
                    (in_RDI->above_txfm_context + in_R9D,in_RDI->left_txfm_context + in_R8D,'\0',
                     (TX_SIZE)((uint)uVar6 >> 0x18));
        }
        else {
          for (iVar4 = 0; iVar4 < tx_size_high_unit[(byte)((uint)uVar6 >> 0x18)];
              iVar4 = iVar2 + iVar4) {
            for (iVar3 = 0; iVar3 < tx_size_wide_unit[(byte)((uint)uVar6 >> 0x18)];
                iVar3 = iVar1 + iVar3) {
              write_tx_size_vartx(in_RSI,(MB_MODE_INFO *)CONCAT44(uVar6,in_ECX),
                                  (TX_SIZE)((uint)in_R8D >> 0x18),in_R9D,
                                  (int)((ulong)pFVar5 >> 0x20),(int)pFVar5,unaff_retaddr);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static inline void write_tx_size_vartx(MACROBLOCKD *xd,
                                       const MB_MODE_INFO *mbmi,
                                       TX_SIZE tx_size, int depth, int blk_row,
                                       int blk_col, aom_writer *w) {
  FRAME_CONTEXT *const ec_ctx = xd->tile_ctx;
  const int max_blocks_high = max_block_high(xd, mbmi->bsize, 0);
  const int max_blocks_wide = max_block_wide(xd, mbmi->bsize, 0);

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;

  if (depth == MAX_VARTX_DEPTH) {
    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);
    return;
  }

  const int ctx = txfm_partition_context(xd->above_txfm_context + blk_col,
                                         xd->left_txfm_context + blk_row,
                                         mbmi->bsize, tx_size);
  const int txb_size_index =
      av1_get_txb_size_index(mbmi->bsize, blk_row, blk_col);
  const int write_txfm_partition =
      tx_size == mbmi->inter_tx_size[txb_size_index];
  if (write_txfm_partition) {
    aom_write_symbol(w, 0, ec_ctx->txfm_partition_cdf[ctx], 2);

    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);
    // TODO(yuec): set correct txfm partition update for qttx
  } else {
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];

    aom_write_symbol(w, 1, ec_ctx->txfm_partition_cdf[ctx], 2);

    if (sub_txs == TX_4X4) {
      txfm_partition_update(xd->above_txfm_context + blk_col,
                            xd->left_txfm_context + blk_row, sub_txs, tx_size);
      return;
    }

    assert(bsw > 0 && bsh > 0);
    for (int row = 0; row < tx_size_high_unit[tx_size]; row += bsh) {
      const int offsetr = blk_row + row;
      for (int col = 0; col < tx_size_wide_unit[tx_size]; col += bsw) {
        const int offsetc = blk_col + col;
        write_tx_size_vartx(xd, mbmi, sub_txs, depth + 1, offsetr, offsetc, w);
      }
    }
  }
}